

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hpp
# Opt level: O1

vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
* __thiscall
crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>::crossover
          (vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           *__return_storage_ptr__,
          DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_> *this,
          vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
          *parents)

{
  undefined1 uVar1;
  pointer pCVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  result_type rVar6;
  size_t __i;
  long lVar7;
  long lVar8;
  uniform_int_distribution<unsigned_long> uni;
  mt19937 rng;
  random_device rd;
  uniform_int_distribution<unsigned_long> local_2730;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2720;
  random_device local_1398;
  
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::vector(__return_storage_ptr__,parents);
  std::random_device::random_device(&local_1398);
  uVar4 = std::random_device::_M_getval();
  local_2720._M_x[0] = (unsigned_long)uVar4;
  lVar7 = 1;
  uVar5 = local_2720._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar7);
    local_2720._M_x[lVar7] = uVar5;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x270);
  local_2720._M_p = 0x270;
  pCVar2 = (parents->
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_2730._M_param._M_b =
       ((long)*(pointer *)
               ((long)&(pCVar2->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl + 8) -
        *(long *)&(pCVar2->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
                  super__Vector_impl_data >> 4) - 1;
  local_2730._M_param._M_a = 0;
  rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                    (&local_2730,&local_2720,&local_2730._M_param);
  if (rVar6 != 0) {
    pCVar2 = (__return_storage_ptr__->
             super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar7 = *(long *)&(pCVar2->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
                      super__Vector_impl_data;
    lVar3 = *(long *)&pCVar2[1]._genes.super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
                      super__Vector_impl_data;
    lVar8 = 0;
    do {
      uVar1 = *(undefined1 *)(lVar7 + 8 + lVar8);
      *(undefined1 *)(lVar7 + 8 + lVar8) = *(undefined1 *)(lVar3 + 8 + lVar8);
      *(undefined1 *)(lVar3 + 8 + lVar8) = uVar1;
      lVar8 = lVar8 + 0x10;
    } while (rVar6 * 0x10 != lVar8);
  }
  rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                    (&local_2730,&local_2720,&local_2730._M_param);
  if (rVar6 != 0) {
    pCVar2 = (__return_storage_ptr__->
             super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar7 = *(long *)&pCVar2[1]._genes.super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
                      super__Vector_impl_data;
    lVar3 = *(long *)&(pCVar2->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
                      super__Vector_impl_data;
    lVar8 = 0;
    do {
      uVar1 = *(undefined1 *)(lVar7 + 8 + lVar8);
      *(undefined1 *)(lVar7 + 8 + lVar8) = *(undefined1 *)(lVar3 + 8 + lVar8);
      *(undefined1 *)(lVar3 + 8 + lVar8) = uVar1;
      lVar8 = lVar8 + 0x10;
    } while (rVar6 * 0x10 != lVar8);
  }
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

std::vector<ChromosomeT> crossover(const std::vector<ChromosomeT> &parents) const
    {
        std::vector<ChromosomeT> children(parents);
        //Select a random crossover point
        std::random_device rd;                                                       // used once to initialise (seed) engine
        std::mt19937 rng(rd());                                                      // random-number engine used (Mersenne-Twister in this case)
        std::uniform_int_distribution<size_t> uni(0u, parents[0].getNumGenes() - 1); // guaranteed unbiased
        auto crossOverPoint = uni(rng);
        std::swap_ranges(children[0].getGenes().begin(),
                         children[0].getGenes().begin() + crossOverPoint,
                         children[1].getGenes().begin());
        crossOverPoint = uni(rng);
        std::swap_ranges(children[1].getGenes().begin(),
                         children[1].getGenes().begin() + crossOverPoint,
                         children[0].getGenes().begin());
        return children;
    }